

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::LocalAccessChainConvertPass::BuildAndAppendVarLoad
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,uint32_t *varId,
          uint32_t *varPteTypeId,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *newInsts)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t resultId;
  uint32_t uVar1;
  Op OVar2;
  DefUseManager *this_00;
  Operand *local_f0;
  allocator<spvtools::opt::Operand> local_dd;
  uint32_t local_dc;
  iterator local_d8;
  undefined8 local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Operand local_a0;
  iterator local_70;
  _func_int **local_68;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_60;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  Instruction *varInst;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *pvStack_38;
  uint32_t ldResultId;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *newInsts_local;
  uint32_t *varPteTypeId_local;
  uint32_t *varId_local;
  Instruction *ptrInst_local;
  LocalAccessChainConvertPass *this_local;
  
  pvStack_38 = newInsts;
  newInsts_local =
       (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        *)varPteTypeId;
  varPteTypeId_local = varId;
  varId_local = (uint32_t *)ptrInst;
  ptrInst_local = (Instruction *)this;
  varInst._4_4_ = Pass::TakeNextId((Pass *)this);
  if (varInst._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = Instruction::GetSingleWordInOperand((Instruction *)varId_local,0);
    *varPteTypeId_local = uVar1;
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    local_48._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )analysis::DefUseManager::GetDef(this_00,*varPteTypeId_local);
    OVar2 = Instruction::opcode((Instruction *)
                                local_48._M_t.
                                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                .
                                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                ._M_head_impl);
    if (OVar2 != OpVariable) {
      __assert_fail("varInst->opcode() == spv::Op::OpVariable",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp"
                    ,0x32,
                    "uint32_t spvtools::opt::LocalAccessChainConvertPass::BuildAndAppendVarLoad(const Instruction *, uint32_t *, uint32_t *, std::vector<std::unique_ptr<Instruction>> *)"
                   );
    }
    uVar1 = Pass::GetPointeeTypeId
                      ((Pass *)this,
                       (Instruction *)
                       local_48._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
    resultId = varInst._4_4_;
    *(uint32_t *)
     &(newInsts_local->
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = uVar1;
    uVar1 = *(uint32_t *)
             &(newInsts_local->
              super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_dc = *varPteTypeId_local;
    local_d8 = &local_dc;
    local_d0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list);
    Operand::Operand(&local_a0,SPV_OPERAND_TYPE_ID,&local_c8);
    local_70 = &local_a0;
    local_68 = (_func_int **)0x1;
    std::allocator<spvtools::opt::Operand>::allocator(&local_dd);
    __l._M_len = (size_type)local_68;
    __l._M_array = local_70;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_60,__l,&local_dd);
    BuildAndAppendInst(this,OpLoad,uVar1,resultId,&local_60,pvStack_38);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_60)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_dd);
    local_f0 = (Operand *)&local_70;
    do {
      local_f0 = local_f0 + -1;
      Operand::~Operand(local_f0);
    } while (local_f0 != &local_a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
    this_local._4_4_ = varInst._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t LocalAccessChainConvertPass::BuildAndAppendVarLoad(
    const Instruction* ptrInst, uint32_t* varId, uint32_t* varPteTypeId,
    std::vector<std::unique_ptr<Instruction>>* newInsts) {
  const uint32_t ldResultId = TakeNextId();
  if (ldResultId == 0) {
    return 0;
  }

  *varId = ptrInst->GetSingleWordInOperand(kAccessChainPtrIdInIdx);
  const Instruction* varInst = get_def_use_mgr()->GetDef(*varId);
  assert(varInst->opcode() == spv::Op::OpVariable);
  *varPteTypeId = GetPointeeTypeId(varInst);
  BuildAndAppendInst(spv::Op::OpLoad, *varPteTypeId, ldResultId,
                     {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {*varId}}},
                     newInsts);
  return ldResultId;
}